

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O3

int __thiscall KParser::_cmp_expr(KParser *this,int begin,BlockInfo *bi)

{
  TokenType TVar1;
  pointer pTVar2;
  _Alloc_hider _Var3;
  pointer pcVar4;
  uint uVar5;
  int iVar6;
  uint begin_00;
  string leftValue;
  string rightValue;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 local_2f0 [32];
  _Alloc_hider local_2d0;
  char local_2c0 [592];
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  char local_40 [16];
  
  pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_330[0] = local_320;
  _Var3._M_p = pTVar2[begin].str._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_330,_Var3._M_p,_Var3._M_p + pTVar2[begin].str._M_string_length);
  pcVar4 = (bi->sLabel)._M_dataplus._M_p;
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar4,pcVar4 + (bi->sLabel)._M_string_length);
  pcVar4 = (bi->eLabel)._M_dataplus._M_p;
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + (bi->eLabel)._M_string_length);
  uVar5 = _add_expr(this,begin,(BlockInfo *)local_70);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((int)uVar5 < 0) {
    uVar5 = 0xffffffff;
  }
  else {
    pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar1 = pTVar2[uVar5].tokenType;
    if (0xfffffff9 < TVar1 - plus) {
      begin_00 = uVar5 + 1;
      local_310[0] = local_300;
      _Var3._M_p = pTVar2[begin_00].str._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_310,_Var3._M_p,_Var3._M_p + pTVar2[begin_00].str._M_string_length);
      local_2f0._0_8_ = local_2f0 + 0x10;
      pcVar4 = (bi->sLabel)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,pcVar4,pcVar4 + (bi->sLabel)._M_string_length);
      pcVar4 = (bi->eLabel)._M_dataplus._M_p;
      local_2d0._M_p = local_2c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,pcVar4,pcVar4 + (bi->eLabel)._M_string_length);
      iVar6 = _add_expr(this,begin_00,(BlockInfo *)local_2f0);
      if (local_2d0._M_p != local_2c0) {
        operator_delete(local_2d0._M_p);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_);
      }
      if (-1 < iVar6) {
        iVar6 = (*(code *)(&DAT_0011154c + *(int *)(&DAT_0011154c + (ulong)(TVar1 - equal) * 4)))();
        return iVar6;
      }
      if (local_310[0] != local_300) {
        operator_delete(local_310[0]);
      }
    }
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0]);
  }
  return uVar5;
}

Assistant:

int KParser::_cmp_expr(int begin,  BlockInfo bi) {
    int i = begin;
    int t;
    std::string leftValue = m_tokens[i].str;
    t = _add_expr(i, bi);
    if (t < 0) {
        return -1;
    }
    i = t;

    do {
        int tryI = i;
        auto tokenValue = m_tokens[tryI].tokenType;
        if(tokenValue != TokenType::equal 
           && tokenValue != TokenType::not_equal
           && tokenValue != TokenType::less_than
           && tokenValue != TokenType::less_than_equal
           && tokenValue != TokenType::greater_than
           && tokenValue != TokenType::greater_than_equal
           ) {
            break;
        }
        tryI++;
        std::string rightValue = m_tokens[tryI].str;
        t = _add_expr(tryI, bi);
        if (t < 0) {
            break;
        }
        // bi.addCode(leftValue);
        // bi.addCode(rightValue);
        if(tokenValue == TokenType::equal) {
            addCode("eq", "", "");
        } else if(tokenValue == TokenType::not_equal) {
            addCode("neq", "", "");
        }else if(tokenValue == TokenType::less_than) {
            printf("lt!!\n");
            addCode("lt", "", "");
        }else if(tokenValue == TokenType::less_than_equal) {
            printf("lte!!\n");
            addCode("lte", "", "");
        }else if(tokenValue == TokenType::greater_than) {
            addCode("gt", "", "");
        }else if(tokenValue == TokenType::greater_than_equal) {
            addCode("gte", "", "");
        } 
        i = t; 
    } while(0);
    return i;
}